

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getChargeMomentum(Thermo *this)

{
  Snapshot *this_00;
  pointer ppAVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  Atom *pAVar4;
  RealType RVar5;
  MoleculeIterator miter;
  MoleculeIterator local_20;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasChargeMomentum == false) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar2 = SimInfo::beginMolecule(this->info_,&local_20);
    RVar5 = 0.0;
LAB_0013a2f8:
    if (pMVar2 != (Molecule *)0x0) {
      ppAVar3 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar3 == ppAVar1) {
        pAVar4 = (Atom *)0x0;
        goto LAB_0013a318;
      }
      do {
        pAVar4 = *ppAVar3;
LAB_0013a318:
        do {
          if (pAVar4 == (Atom *)0x0) {
            pMVar2 = SimInfo::nextMolecule(this->info_,&local_20);
            goto LAB_0013a2f8;
          }
          RVar5 = pAVar4->chargeMass_ *
                  *(double *)
                   (*(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar4->super_StuntDouble).storage_) +
                   (long)(pAVar4->super_StuntDouble).localIndex_ * 8) + RVar5;
          ppAVar3 = ppAVar3 + 1;
          pAVar4 = (Atom *)0x0;
        } while (ppAVar3 == ppAVar1);
      } while( true );
    }
    Snapshot::setChargeMomentum(this_00,RVar5);
  }
  RVar5 = Snapshot::getChargeMomentum(this_00);
  return RVar5;
}

Assistant:

RealType Thermo::getChargeMomentum() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasChargeMomentum) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator iiter;
      Molecule* mol;
      Atom* atom;
      RealType cvel;
      RealType cmass;
      RealType momentum(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginFluctuatingCharge(iiter); atom != NULL;
             atom = mol->nextFluctuatingCharge(iiter)) {
          cmass = atom->getChargeMass();
          cvel  = atom->getFlucQVel();

          momentum += cmass * cvel;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &momentum, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      snap->setChargeMomentum(momentum);
    }

    return snap->getChargeMomentum();
  }